

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  uint uVar5;
  undefined2 uVar6;
  float fVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  uint *puVar15;
  bool bVar16;
  uint16 uVar17;
  uint i;
  int iVar18;
  uint32 uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar23;
  uint64 uVar24;
  uint64 uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar29;
  ulong uVar30;
  uint j;
  uint *puVar31;
  color_quad_u8 *pcVar32;
  ulong uVar33;
  uchar *puVar34;
  uint uVar35;
  uint uVar36;
  undefined4 in_register_0000003c;
  long lVar37;
  undefined7 in_register_00000089;
  int iVar38;
  ulong uVar39;
  undefined8 uVar40;
  uint i_3;
  bool bVar41;
  undefined2 uVar97;
  float fVar42;
  float fVar43;
  double dVar44;
  undefined1 auVar53 [16];
  float in_XMM1_Da;
  double dVar56;
  double dVar59;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined2 uVar98;
  int iVar73;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM3_Ba;
  undefined1 uVar74;
  undefined1 in_XMM3_Bb;
  undefined1 uVar75;
  undefined1 in_XMM3_Bc;
  undefined1 uVar76;
  undefined1 in_XMM3_Bd;
  undefined1 uVar77;
  undefined1 in_XMM3_Be;
  undefined1 uVar78;
  undefined1 in_XMM3_Bf;
  undefined1 uVar79;
  undefined1 in_XMM3_Bg;
  undefined1 uVar80;
  undefined1 in_XMM3_Bh;
  undefined1 uVar81;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  double dVar82;
  double dVar83;
  double dVar84;
  undefined1 auVar85 [16];
  double dVar86;
  byte bVar87;
  int iVar88;
  double dVar89;
  int iVar91;
  double dVar92;
  undefined1 auVar90 [16];
  double dVar93;
  undefined1 auVar94 [16];
  double dVar95;
  undefined1 auVar96 [16];
  int max [3];
  uint ave_color [3];
  uint c;
  vec3F scaled_principle_axis;
  vec3F initial_ofs;
  int min [3];
  vec3F probe_high_color;
  vec3F probe_low_color;
  uint probe_low [17];
  double covf [6];
  byte local_248 [6];
  byte local_242;
  undefined1 local_241;
  undefined1 local_240;
  undefined1 local_23f;
  undefined1 local_23e;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  bool local_229;
  undefined8 local_228;
  undefined1 *local_220;
  uint *local_218;
  uchar *local_210;
  undefined8 local_208;
  long lStack_200;
  long local_1f8;
  uint *local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_1c0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1b8;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a0 [4];
  undefined8 local_190;
  float local_188;
  uint64 local_180;
  uint *local_178;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_170;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_16c;
  undefined8 local_168;
  float local_160;
  dxt1_block local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint local_134;
  float local_130 [6];
  ulong local_118;
  uint8 *local_110;
  ulong local_108;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_100;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_fc;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  double local_c8 [10];
  double local_78 [9];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar54 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar55 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar45 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar71 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar62 [16];
  
  local_180 = CONCAT44(local_180._4_4_,(int)CONCAT71(in_register_00000089,refine));
  local_228 = CONCAT44(in_register_0000003c,n);
  uVar33 = (ulong)n;
  lVar37 = 0;
  pcVar32 = block;
  do {
    bVar87 = (block->field_0).c[lVar37];
    uVar20 = (ulong)bVar87;
    uVar36 = (uint)bVar87;
    uVar35 = (uint)bVar87;
    if (4 < n * 4) {
      uVar30 = 4;
      uVar21 = uVar20;
      uVar39 = uVar20;
      do {
        bVar87 = (pcVar32->field_0).c[uVar30];
        uVar20 = uVar20 + bVar87;
        if ((uint)bVar87 <= (uint)uVar21) {
          uVar21 = (ulong)bVar87;
        }
        uVar36 = (uint)uVar21;
        uVar35 = (uint)bVar87;
        if ((uint)bVar87 < (uint)uVar39) {
          uVar35 = (uint)uVar39;
        }
        uVar30 = uVar30 + 4;
        uVar39 = (ulong)uVar35;
      } while (uVar30 < n * 4);
    }
    local_1a0[lVar37] = (uint)((uVar20 + (n >> 1)) / uVar33);
    *(uint *)(local_158.m_low_color + lVar37 * 4) = uVar36;
    *(uint *)((long)&local_208 + lVar37 * 4) = uVar35;
    lVar37 = lVar37 + 1;
    pcVar32 = (color_quad_u8 *)((long)&pcVar32->field_0 + 1);
  } while (lVar37 != 3);
  local_1e8 = high16;
  local_218 = low16;
  if (((local_158._0_4_ == (uint)local_208) && (local_158.m_selectors == local_208._4_4_)) &&
     ((int)uStack_150 == (int)lStack_200)) {
    bVar16 = false;
  }
  else {
    local_c8[4] = 0.0;
    local_c8[5] = 0.0;
    local_c8[2] = 0.0;
    local_c8[3] = 0.0;
    local_c8[1] = 0.0;
    if (n == 0) {
      local_c8[0] = 0.0;
    }
    else {
      local_c8[1] = 0.0;
      uVar74 = 0;
      uVar75 = 0;
      uVar76 = 0;
      uVar77 = 0;
      uVar78 = 0;
      uVar79 = 0;
      uVar80 = 0;
      uVar81 = 0;
      local_c8[0] = 0.0;
      uVar20 = 0;
      do {
        dVar86 = (double)(int)(block[uVar20].field_0.field_0.r - local_1a0[0]);
        local_c8[0] = local_c8[0] + dVar86 * dVar86;
        uVar4 = *(undefined2 *)((long)&block[uVar20].field_0 + 1);
        bVar87 = (byte)((ushort)uVar4 >> 8);
        dVar44 = (double)(int)((CONCAT12(bVar87,uVar4) & 0xff) - local_1a0[1]);
        dVar56 = (double)(int)(bVar87 - local_1a0[2]);
        local_c8[1] = local_c8[1] + dVar86 * dVar44;
        local_c8[2] = local_c8[2] + dVar86 * dVar56;
        local_c8[3] = (double)CONCAT17(uVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,
                                                  CONCAT13(uVar77,CONCAT12(uVar76,CONCAT11(uVar75,
                                                  uVar74))))))) + dVar44 * dVar44;
        uVar74 = SUB81(local_c8[3],0);
        uVar75 = (undefined1)((ulong)local_c8[3] >> 8);
        uVar76 = (undefined1)((ulong)local_c8[3] >> 0x10);
        uVar77 = (undefined1)((ulong)local_c8[3] >> 0x18);
        uVar78 = (undefined1)((ulong)local_c8[3] >> 0x20);
        uVar79 = (undefined1)((ulong)local_c8[3] >> 0x28);
        uVar80 = (undefined1)((ulong)local_c8[3] >> 0x30);
        uVar81 = (undefined1)((ulong)local_c8[3] >> 0x38);
        local_c8[4] = local_c8[4] + dVar44 * dVar56;
        local_c8[5] = local_c8[5] + dVar56 * dVar56;
        uVar20 = uVar20 + 1;
      } while (uVar33 != uVar20);
      auVar85._8_4_ = SUB84(local_c8[4],0);
      auVar85._0_8_ = local_c8[3];
      auVar85._12_4_ = (int)((ulong)local_c8[4] >> 0x20);
      local_c8[4] = auVar85._8_8_;
    }
    lVar37 = 0;
    do {
      dVar86 = local_c8[lVar37 + 1];
      local_78[lVar37] = local_c8[lVar37] * 0.003921568859368563;
      local_78[lVar37 + 1] = dVar86 * 0.003921568859368563;
      lVar37 = lVar37 + 2;
    } while (lVar37 != 6);
    dVar56 = (double)((int)lStack_200 - (int)uStack_150);
    iVar88 = 4;
    dVar86 = (double)(int)((uint)local_208 - local_158._0_4_);
    dVar44 = (double)((int)local_208._4_4_ - (int)local_158.m_selectors);
    do {
      dVar59 = dVar56 * local_78[2] + local_78[1] * dVar44 + local_78[0] * dVar86;
      dVar60 = dVar56 * local_78[4] + local_78[1] * dVar86 + local_78[3] * dVar44;
      dVar56 = dVar44 * local_78[4] + dVar86 * local_78[2] + local_78[5] * dVar56;
      iVar88 = iVar88 + -1;
      dVar86 = dVar59;
      dVar44 = dVar60;
    } while (iVar88 != 0);
    dVar86 = ABS(dVar59);
    if (ABS(dVar59) <= ABS(dVar60)) {
      dVar86 = ABS(dVar60);
    }
    if (dVar86 <= ABS(dVar56)) {
      dVar86 = ABS(dVar56);
    }
    if (4.0 <= dVar86) {
      dVar86 = 512.0 / dVar86;
      iVar91 = (int)(dVar59 * dVar86);
      iVar73 = (int)(dVar60 * dVar86);
      iVar88 = (int)(dVar56 * dVar86);
      fVar42 = (float)(dVar59 * dVar86);
      in_XMM3_Ba = SUB41(fVar42,0);
      in_XMM3_Bb = (undefined1)((uint)fVar42 >> 8);
      in_XMM3_Bc = (undefined1)((uint)fVar42 >> 0x10);
      in_XMM3_Bd = (undefined1)((uint)fVar42 >> 0x18);
      fVar42 = (float)(dVar60 * dVar86);
      in_XMM3_Be = SUB41(fVar42,0);
      in_XMM3_Bf = (undefined1)((uint)fVar42 >> 8);
      in_XMM3_Bg = (undefined1)((uint)fVar42 >> 0x10);
      in_XMM3_Bh = (undefined1)((uint)fVar42 >> 0x18);
      in_XMM1_Da = (float)(dVar56 * dVar86);
    }
    else {
      iVar91 = 0x94;
      iVar73 = 300;
      in_XMM3_Ba = 0;
      in_XMM3_Bb = 0;
      in_XMM3_Bc = 0x14;
      in_XMM3_Bd = 0x43;
      in_XMM3_Be = 0;
      in_XMM3_Bf = 0;
      in_XMM3_Bg = 0x96;
      in_XMM3_Bh = 0x43;
      iVar88 = 0x3a;
      in_XMM1_Da = 58.0;
    }
    in_XMM3_Dd = 0;
    in_XMM3_Dc = 0;
    bVar87 = (block->field_0).field_0.r;
    bVar1 = (block->field_0).field_0.g;
    bVar2 = (block->field_0).field_0.b;
    local_220 = (undefined1 *)CONCAT71(local_220._1_7_,bVar2);
    local_1c0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                CONCAT71(local_1c0._1_7_,bVar1);
    local_178 = (uint *)CONCAT71(local_178._1_7_,bVar87);
    if (n < 2) {
      local_1d8[0] = bVar1;
      local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar87);
    }
    else {
      iVar28 = (uint)bVar2 * iVar88 + (uint)bVar87 * iVar91 + (uint)bVar1 * iVar73;
      lVar37 = 0;
      local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar87);
      local_1d8[0] = bVar1;
      iVar18 = iVar28;
      do {
        bVar87 = block[lVar37 + 1].field_0.field_0.r;
        bVar1 = block[lVar37 + 1].field_0.field_0.g;
        bVar3 = block[lVar37 + 1].field_0.field_0.b;
        iVar38 = (uint)bVar3 * iVar88 + (uint)bVar1 * iVar73 + (uint)bVar87 * iVar91;
        if (iVar38 < iVar18) {
          local_1d8[0] = bVar1;
          local_210 = (uchar *)CONCAT71(local_210._1_7_,bVar87);
          iVar18 = iVar38;
          bVar2 = bVar3;
        }
        if (iVar28 < iVar38) {
          local_220 = (undefined1 *)CONCAT71(local_220._1_7_,bVar3);
          local_1c0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                      CONCAT71(local_1c0._1_7_,bVar1);
          local_178 = (uint *)CONCAT71(local_178._1_7_,bVar87);
          iVar28 = iVar38;
        }
        lVar37 = lVar37 + 1;
      } while (uVar33 - 1 != lVar37);
    }
    *low16 = (((uint)(byte)local_220 * 0x1f + 0x80 >> 8) + (uint)(byte)local_220 * 0x1f + 0x80 >> 8)
             + (((uint)(byte)local_1c0 * 0x3f + 0x80 >> 8) + (uint)(byte)local_1c0 * 0x3f + 0x80 >>
                3 & 0x1fe0) +
             ((uint)(byte)local_178 * 0x1f + ((uint)(byte)local_178 * 0x1f + 0x80 >> 8) + 0x80 &
             0x7f00) * 8;
    *high16 = (((uint)bVar2 * 0x1f + 0x80 >> 8) + (uint)bVar2 * 0x1f + 0x80 >> 8) +
              (((uint)local_1d8[0] * 0x3f + 0x80 >> 8) + (uint)local_1d8[0] * 0x3f + 0x80 >> 3 &
              0x1fe0) + (((uint)(byte)local_210 * 0x1f + 0x80 >> 8) + (uint)(byte)local_210 * 0x1f +
                         0x80 & 0x7f00) * 8;
    bVar16 = true;
    low16 = local_218;
    high16 = local_1e8;
  }
  if (bVar16) {
    local_1d8[1] = in_XMM3_Bb;
    local_1d8[0] = in_XMM3_Ba;
    local_1d8[2] = in_XMM3_Bc;
    local_1d8[3] = in_XMM3_Bd;
    local_1d8[4] = in_XMM3_Be;
    local_1d8[5] = in_XMM3_Bf;
    local_1d8[6] = in_XMM3_Bg;
    local_1d8[7] = in_XMM3_Bh;
    local_1d8._8_4_ = in_XMM3_Dc;
    local_1d8._12_4_ = in_XMM3_Dd;
    bVar16 = determine_selectors(n,block,*low16,*high16,pSelectors);
    if (bVar16) {
      if (n == 0) {
        dVar56 = 0.0;
        dVar59 = 0.0;
        dVar44 = 0.0;
        dVar84 = 0.0;
        dVar60 = 0.0;
        uVar20 = CONCAT17(in_XMM3_Bh,
                          CONCAT16(in_XMM3_Bg,
                                   CONCAT15(in_XMM3_Bf,
                                            CONCAT14(in_XMM3_Be,
                                                     CONCAT13(in_XMM3_Bd,
                                                              CONCAT12(in_XMM3_Bc,
                                                                       CONCAT11(in_XMM3_Bb,
                                                                                in_XMM3_Ba))))))) ^
                 CONCAT17(in_XMM3_Bh,
                          CONCAT16(in_XMM3_Bg,
                                   CONCAT15(in_XMM3_Bf,
                                            CONCAT14(in_XMM3_Be,
                                                     CONCAT13(in_XMM3_Bd,
                                                              CONCAT12(in_XMM3_Bc,
                                                                       CONCAT11(in_XMM3_Bb,
                                                                                in_XMM3_Ba)))))));
        uVar74 = (undefined1)uVar20;
        uVar75 = (undefined1)(uVar20 >> 8);
        uVar76 = (undefined1)(uVar20 >> 0x10);
        uVar77 = (undefined1)(uVar20 >> 0x18);
        uVar78 = (undefined1)(uVar20 >> 0x20);
        uVar79 = (undefined1)(uVar20 >> 0x28);
        uVar80 = (undefined1)(uVar20 >> 0x30);
        uVar81 = (undefined1)(uVar20 >> 0x38);
        dVar86 = 0.0;
        dVar82 = 0.0;
        dVar83 = 0.0;
      }
      else {
        dVar60 = 0.0;
        uVar21 = 0;
        dVar84 = 0.0;
        dVar44 = 0.0;
        dVar56 = 0.0;
        dVar59 = 0.0;
        dVar82 = 0.0;
        dVar83 = 0.0;
        uVar20 = CONCAT17(in_XMM3_Bh,
                          CONCAT16(in_XMM3_Bg,
                                   CONCAT15(in_XMM3_Bf,
                                            CONCAT14(in_XMM3_Be,
                                                     CONCAT13(in_XMM3_Bd,
                                                              CONCAT12(in_XMM3_Bc,
                                                                       CONCAT11(in_XMM3_Bb,
                                                                                in_XMM3_Ba))))))) ^
                 CONCAT17(in_XMM3_Bh,
                          CONCAT16(in_XMM3_Bg,
                                   CONCAT15(in_XMM3_Bf,
                                            CONCAT14(in_XMM3_Be,
                                                     CONCAT13(in_XMM3_Bd,
                                                              CONCAT12(in_XMM3_Bc,
                                                                       CONCAT11(in_XMM3_Bb,
                                                                                in_XMM3_Ba)))))));
        uVar74 = (undefined1)uVar20;
        uVar75 = (undefined1)(uVar20 >> 8);
        uVar76 = (undefined1)(uVar20 >> 0x10);
        uVar77 = (undefined1)(uVar20 >> 0x18);
        uVar78 = (undefined1)(uVar20 >> 0x20);
        uVar79 = (undefined1)(uVar20 >> 0x28);
        uVar80 = (undefined1)(uVar20 >> 0x30);
        uVar81 = (undefined1)(uVar20 >> 0x38);
        dVar86 = 0.0;
        do {
          dVar93 = (double)block[uVar21].field_0.field_0.b;
          bVar87 = pSelectors[uVar21];
          dVar60 = dVar60 + (double)dxt1_endpoint_optimizer::refine_solution::prods_1[bVar87];
          dVar82 = dVar82 + (double)dxt1_endpoint_optimizer::refine_solution::prods_2[bVar87];
          dVar83 = dVar83 + (double)dxt1_endpoint_optimizer::refine_solution::prods_0[bVar87];
          dVar95 = (double)dxt1_endpoint_optimizer::refine_solution::w1Tab[bVar87];
          dVar89 = (double)(block[uVar21].field_0.m_u32 & 0xff);
          dVar92 = (double)(block[uVar21].field_0.m_u32 >> 8 & 0xff);
          dVar44 = dVar44 + dVar93;
          dVar56 = dVar56 + dVar95 * dVar89;
          dVar59 = dVar59 + dVar95 * dVar92;
          dVar84 = dVar84 + dVar93 * dVar95;
          dVar89 = (double)CONCAT17(uVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,CONCAT13(
                                                  uVar77,CONCAT12(uVar76,CONCAT11(uVar75,uVar74)))))
                                                  )) + dVar89;
          uVar74 = SUB81(dVar89,0);
          uVar75 = (undefined1)((ulong)dVar89 >> 8);
          uVar76 = (undefined1)((ulong)dVar89 >> 0x10);
          uVar77 = (undefined1)((ulong)dVar89 >> 0x18);
          uVar78 = (undefined1)((ulong)dVar89 >> 0x20);
          uVar79 = (undefined1)((ulong)dVar89 >> 0x28);
          uVar80 = (undefined1)((ulong)dVar89 >> 0x30);
          uVar81 = (undefined1)((ulong)dVar89 >> 0x38);
          dVar86 = dVar86 + dVar92;
          uVar21 = uVar21 + 1;
        } while (uVar33 != uVar21);
        dVar44 = dVar44 * 3.0;
        dVar89 = dVar89 * 3.0;
        uVar74 = SUB81(dVar89,0);
        uVar75 = (undefined1)((ulong)dVar89 >> 8);
        uVar76 = (undefined1)((ulong)dVar89 >> 0x10);
        uVar77 = (undefined1)((ulong)dVar89 >> 0x18);
        uVar78 = (undefined1)((ulong)dVar89 >> 0x20);
        uVar79 = (undefined1)((ulong)dVar89 >> 0x28);
        uVar80 = (undefined1)((ulong)dVar89 >> 0x30);
        uVar81 = (undefined1)((ulong)dVar89 >> 0x38);
        dVar86 = dVar86 * 3.0;
      }
      if ((((dVar60 != 0.0) || (NAN(dVar60))) && ((dVar82 != 0.0 || (NAN(dVar82))))) &&
         (dVar89 = dVar60 * dVar82 - dVar83 * dVar83, 1.249999968422344e-05 <= ABS(dVar89))) {
        dVar92 = (double)CONCAT17(uVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,CONCAT13(
                                                  uVar77,CONCAT12(uVar76,CONCAT11(uVar75,uVar74)))))
                                                 )) - dVar56;
        dVar89 = 0.364705890417099 / dVar89;
        uVar27 = *high16;
        uVar5 = *low16;
        iVar88 = (int)((dVar60 * dVar56 - dVar92 * dVar83) * dVar89 + 0.5);
        iVar91 = (int)((dVar60 * dVar59 - (dVar86 - dVar59) * dVar83) * dVar89 * 2.0322580337524414
                      + 0.5);
        auVar85 = ZEXT816(0x3f0000001f);
        auVar94._0_8_ = CONCAT44(-(uint)(iVar91 < auVar85._4_4_),-(uint)(iVar88 < auVar85._0_4_));
        auVar94._8_8_ = 0;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = CONCAT44(iVar91,iVar88) & auVar94._0_8_;
        auVar90 = ~auVar94 & auVar85 | auVar90;
        auVar96._0_4_ = -(uint)(0 < auVar90._0_4_);
        auVar96._4_4_ = -(uint)(0 < auVar90._4_4_);
        auVar96._8_4_ = -(uint)(0 < auVar90._8_4_);
        auVar96._12_4_ = -(uint)(0 < auVar90._12_4_);
        uVar35 = (uint)((dVar60 * dVar84 - (dVar44 - dVar84) * dVar83) * dVar89 + 0.5);
        if (0x1e < (int)uVar35) {
          uVar35 = 0x1f;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        iVar88 = (int)((dVar82 * dVar92 - dVar56 * dVar83) * dVar89 + 0.5);
        iVar91 = (int)((dVar82 * (dVar86 - dVar59) - dVar59 * dVar83) * dVar89 * 2.0322580337524414
                      + 0.5);
        *low16 = SUB164(auVar96 & auVar90,4) << 5 | SUB164(auVar96 & auVar90,0) << 0xb | uVar35;
        auVar61._0_8_ = CONCAT44(-(uint)(iVar91 < auVar85._4_4_),-(uint)(iVar88 < auVar85._0_4_));
        auVar61._8_8_ = 0;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = CONCAT44(iVar91,iVar88) & auVar61._0_8_;
        auVar57 = ~auVar61 & auVar85 | auVar57;
        auVar58._0_4_ = -(uint)(0 < auVar57._0_4_);
        auVar58._4_4_ = -(uint)(0 < auVar57._4_4_);
        auVar58._8_4_ = -(uint)(0 < auVar57._8_4_);
        auVar58._12_4_ = -(uint)(0 < auVar57._12_4_);
        uVar36 = (uint)(((dVar44 - dVar84) * dVar82 - dVar83 * dVar84) * dVar89 + 0.5);
        uVar35 = 0x1f;
        if ((int)uVar36 < 0x1f) {
          uVar35 = uVar36;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar35 = SUB164(auVar58 & auVar57,4) << 5 | SUB164(auVar58 & auVar57,0) << 0xb | uVar35;
        *high16 = uVar35;
        if ((uVar27 != uVar35) || (uVar5 != *low16)) {
          determine_selectors(n,block,*low16,*high16,pSelectors);
          n = (uint)local_228;
        }
      }
      if ((char)local_180 != '\0') {
        local_180 = determine_error(n,block,*low16,*high16,0xffffffffffffffff);
        n = (uint)local_228;
        if (local_180 != 0) {
          fVar42 = in_XMM1_Da * in_XMM1_Da +
                   local_1d8._4_4_ * local_1d8._4_4_ + local_1d8._0_4_ * local_1d8._0_4_;
          if (fVar42 < 0.0) {
            fVar42 = sqrtf(fVar42);
          }
          else {
            fVar42 = SQRT(fVar42);
          }
          fVar42 = 1.0 / fVar42;
          fVar43 = (float)CONCAT13(local_1d8[3],
                                   CONCAT12(local_1d8[2],CONCAT11(local_1d8[1],local_1d8[0]))) *
                   fVar42;
          uVar74 = SUB41(fVar43,0);
          uVar75 = (undefined1)((uint)fVar43 >> 8);
          uVar76 = (undefined1)((uint)fVar43 >> 0x10);
          uVar77 = (undefined1)((uint)fVar43 >> 0x18);
          fVar7 = (float)CONCAT13(local_1d8[7],
                                  CONCAT12(local_1d8[6],CONCAT11(local_1d8[5],local_1d8[4]))) *
                  fVar42;
          uVar78 = SUB41(fVar7,0);
          uVar79 = (undefined1)((uint)fVar7 >> 8);
          uVar80 = (undefined1)((uint)fVar7 >> 0x10);
          uVar81 = (undefined1)((uint)fVar7 >> 0x18);
          local_d8 = CONCAT17(uVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,fVar43))));
          local_d0 = in_XMM1_Da * fVar42;
          lVar37 = 0;
          do {
            *(float *)((long)&local_190 + lVar37 * 4) =
                 *(float *)((long)&local_d8 + lVar37 * 4) * 0.027063293;
            lVar37 = lVar37 + 1;
          } while (lVar37 != 3);
          local_190 = CONCAT44((float)((ulong)local_190 >> 0x20) * 63.0,(float)local_190 * 31.0);
          local_188 = local_188 * 31.0;
          lVar37 = 0;
          do {
            *(float *)((long)&local_168 + lVar37 * 4) =
                 *(float *)((long)&local_190 + lVar37 * 4) * -8.0;
            lVar37 = lVar37 + 1;
          } while (lVar37 != 3);
          local_168 = CONCAT44((float)((ulong)local_168 >> 0x20) + 0.5,(float)local_168 + 0.5);
          local_160 = local_160 + 0.5;
          local_1dc = 0;
          local_110 = pSelectors;
          local_108 = uVar33;
          do {
            dxt1_block::unpack_color(&local_158,(uint16)*low16,false,0xff);
            uVar26 = (uint)local_158.m_high_color[0];
            local_1d8 = ZEXT416((uint)local_158._0_4_);
            dxt1_block::unpack_color(&local_158,(uint16)*high16,false,0xff);
            uVar35 = CONCAT13(uVar77,CONCAT12(uVar76,CONCAT11(uVar75,uVar74))) ^
                     CONCAT13(uVar77,CONCAT12(uVar76,CONCAT11(uVar75,uVar74)));
            uVar74 = (undefined1)uVar35;
            uVar75 = (undefined1)(uVar35 >> 8);
            uVar76 = (undefined1)(uVar35 >> 0x10);
            uVar77 = (undefined1)(uVar35 >> 0x18);
            uVar36 = CONCAT13(uVar81,CONCAT12(uVar80,CONCAT11(uVar79,uVar78))) ^
                     CONCAT13(uVar81,CONCAT12(uVar80,CONCAT11(uVar79,uVar78)));
            uVar78 = (undefined1)uVar36;
            uVar79 = (undefined1)(uVar36 >> 8);
            uVar80 = (undefined1)(uVar36 >> 0x10);
            uVar81 = (undefined1)(uVar36 >> 0x18);
            auVar52._0_14_ = local_1d8._0_14_;
            auVar52[0xe] = local_1d8[7];
            auVar52[0xf] = uVar81;
            auVar51._14_2_ = auVar52._14_2_;
            auVar51._0_13_ = local_1d8._0_13_;
            auVar51[0xd] = uVar80;
            auVar50._13_3_ = auVar51._13_3_;
            auVar50._0_12_ = local_1d8._0_12_;
            auVar50[0xc] = local_1d8[6];
            auVar49._12_4_ = auVar50._12_4_;
            auVar49._0_11_ = local_1d8._0_11_;
            auVar49[0xb] = uVar79;
            auVar48._11_5_ = auVar49._11_5_;
            auVar48._0_10_ = local_1d8._0_10_;
            auVar48[10] = local_1d8[5];
            auVar47._10_6_ = auVar48._10_6_;
            auVar47._0_9_ = local_1d8._0_9_;
            auVar47[9] = uVar78;
            auVar46._9_7_ = auVar47._9_7_;
            auVar46._0_8_ = local_1d8._0_8_;
            auVar46[8] = local_1d8[4];
            Var10 = CONCAT91(CONCAT81(auVar46._8_8_,uVar77),local_1d8[3]);
            auVar9._2_10_ = Var10;
            auVar9[1] = uVar76;
            auVar9[0] = local_1d8[2];
            auVar8._2_12_ = auVar9;
            auVar8[1] = uVar75;
            auVar8[0] = local_1d8[1];
            uVar97 = CONCAT11(uVar74,local_1d8[0]);
            auVar45._2_14_ = auVar8;
            uVar6 = (undefined2)(uVar36 >> 0x10);
            auVar55._0_12_ = auVar45._0_12_;
            auVar55._12_2_ = (short)Var10;
            auVar55._14_2_ = uVar6;
            auVar54._12_4_ = auVar55._12_4_;
            auVar54._0_10_ = auVar45._0_10_;
            auVar54._10_2_ = (short)uVar36;
            auVar53._10_6_ = auVar54._10_6_;
            auVar53._0_8_ = auVar45._0_8_;
            auVar53._8_2_ = auVar9._0_2_;
            uVar4 = (undefined2)(uVar35 >> 0x10);
            auVar11._4_8_ = auVar53._8_8_;
            auVar11._2_2_ = uVar4;
            auVar11._0_2_ = auVar8._0_2_;
            local_e8 = CONCAT44((float)auVar11._0_4_,(float)CONCAT22((short)uVar35,uVar97));
            local_e0 = (float)uVar26;
            auVar69._0_15_ = ZEXT415(0);
            auVar69[0xf] = uVar81;
            auVar68._14_2_ = auVar69._14_2_;
            auVar68._0_13_ = ZEXT413(0);
            auVar68[0xd] = uVar80;
            auVar67._13_3_ = auVar68._13_3_;
            auVar67._0_13_ = ZEXT413(0);
            auVar66._12_4_ = auVar67._12_4_;
            auVar66._0_11_ = ZEXT411(0);
            auVar66[0xb] = uVar79;
            auVar65._11_5_ = auVar66._11_5_;
            auVar65._0_11_ = ZEXT411(0);
            auVar64._10_6_ = auVar65._10_6_;
            auVar64._0_9_ = (unkuint9)0;
            auVar64[9] = uVar78;
            auVar63._9_7_ = auVar64._9_7_;
            auVar63._0_9_ = (unkuint9)0;
            Var10 = CONCAT91(CONCAT81(auVar63._8_8_,uVar77),local_158.m_high_color[1]);
            auVar14._2_10_ = Var10;
            auVar14[1] = uVar76;
            auVar14[0] = local_158.m_high_color[0];
            auVar12._2_12_ = auVar14;
            auVar12[1] = uVar75;
            auVar12[0] = local_158.m_low_color[1];
            uVar98 = CONCAT11(uVar74,local_158.m_low_color[0]);
            auVar62._2_14_ = auVar12;
            auVar72._0_12_ = auVar62._0_12_;
            auVar72._12_2_ = (short)Var10;
            auVar72._14_2_ = uVar6;
            auVar71._12_4_ = auVar72._12_4_;
            auVar71._0_10_ = auVar62._0_10_;
            auVar71._10_2_ = (short)uVar36;
            auVar70._10_6_ = auVar71._10_6_;
            auVar70._0_8_ = auVar62._0_8_;
            auVar70._8_2_ = auVar14._0_2_;
            auVar13._4_8_ = auVar70._8_8_;
            auVar13._2_2_ = uVar4;
            auVar13._0_2_ = auVar12._0_2_;
            local_f8 = CONCAT44((float)auVar13._0_4_,(float)CONCAT22((short)uVar35,uVar98));
            local_f0 = (float)local_158.m_high_color[0];
            lVar37 = 0;
            do {
              local_130[lVar37 + 3] =
                   *(float *)((long)&local_e8 + lVar37 * 4) +
                   *(float *)((long)&local_168 + lVar37 * 4);
              lVar37 = lVar37 + 1;
            } while (lVar37 != 3);
            lVar37 = 0;
            do {
              fVar42 = local_130[4];
              fVar43 = floorf(local_130[3]);
              iVar88 = (int)fVar43;
              if (0x1e < iVar88) {
                iVar88 = 0x1f;
              }
              if (iVar88 < 1) {
                iVar88 = 0;
              }
              fVar42 = floorf(fVar42);
              iVar91 = (int)fVar42;
              if (0x3e < iVar91) {
                iVar91 = 0x3f;
              }
              if (iVar91 < 1) {
                iVar91 = 0;
              }
              fVar42 = floorf(local_130[5]);
              uVar35 = (uint)fVar42;
              if (0x1e < (int)uVar35) {
                uVar35 = 0x1f;
              }
              if ((int)uVar35 < 1) {
                uVar35 = 0;
              }
              *(uint *)((long)local_c8 + lVar37 * 4) = iVar88 << 0xb | iVar91 << 5 | uVar35;
              lVar22 = 0;
              do {
                local_130[lVar22 + 3] =
                     *(float *)((long)&local_190 + lVar22 * 4) + local_130[lVar22 + 3];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              lVar37 = lVar37 + 1;
            } while (lVar37 != 0x11);
            lVar37 = 0;
            do {
              local_130[lVar37] =
                   *(float *)((long)&local_f8 + lVar37 * 4) +
                   *(float *)((long)&local_168 + lVar37 * 4);
              lVar37 = lVar37 + 1;
            } while (lVar37 != 3);
            lVar37 = 0;
            do {
              fVar42 = local_130[1];
              fVar43 = floorf(local_130[0]);
              iVar88 = (int)fVar43;
              if (0x1e < iVar88) {
                iVar88 = 0x1f;
              }
              if (iVar88 < 1) {
                iVar88 = 0;
              }
              fVar42 = floorf(fVar42);
              iVar91 = (int)fVar42;
              if (0x3e < iVar91) {
                iVar91 = 0x3f;
              }
              if (iVar91 < 1) {
                iVar91 = 0;
              }
              fVar42 = floorf(local_130[2]);
              uVar35 = (uint)fVar42;
              if (0x1e < (int)uVar35) {
                uVar35 = 0x1f;
              }
              if ((int)uVar35 < 1) {
                uVar35 = 0;
              }
              *(uint *)((long)local_78 + lVar37 * 4) = iVar88 << 0xb | iVar91 << 5 | uVar35;
              lVar22 = 0;
              do {
                local_130[lVar22] = *(float *)((long)&local_190 + lVar22 * 4) + local_130[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              lVar37 = lVar37 + 1;
            } while (lVar37 != 0x11);
            uVar35 = *local_218;
            local_148 = 0;
            uStack_140 = 0;
            local_158.m_low_color[0] = '\0';
            local_158.m_low_color[1] = '\0';
            local_158.m_high_color[0] = '\0';
            local_158.m_high_color[1] = '\0';
            local_158.m_selectors[0] = '\0';
            local_158.m_selectors[1] = '\0';
            local_158.m_selectors[2] = '\0';
            local_158.m_selectors[3] = '\0';
            uStack_150 = 0;
            local_220 = (undefined1 *)CONCAT44(local_220._4_4_,*local_1e8);
            local_1a0[3] = *local_1e8 << 0x10 | uVar35;
            local_1a0[3] = fast_hash(local_1a0 + 3,4);
            *(long *)(local_158.m_low_color + (local_1a0[3] >> 3 & 0x18)) =
                 1L << ((byte)local_1a0[3] & 0x3f);
            paVar23 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)0x0;
            do {
              local_1c0 = paVar23;
              local_1d8._0_4_ = *(undefined4 *)((long)local_c8 + (long)paVar23 * 4);
              lVar37 = 0;
              do {
                uVar36 = *(uint *)((long)local_78 + lVar37 * 4);
                uVar27 = uVar36;
                if ((uint)local_1d8._0_4_ >= uVar36 && local_1d8._0_4_ != uVar36) {
                  uVar27 = local_1d8._0_4_;
                }
                if ((uint)local_1d8._0_4_ < uVar36) {
                  uVar36 = local_1d8._0_4_;
                }
                local_208._0_4_ = uVar36 << 0x10 | uVar27;
                uVar19 = fast_hash(&local_208,4);
                uVar25 = local_180;
                local_208 = CONCAT44(local_208._4_4_,uVar19);
                uVar26 = uVar19 >> 6 & 3;
                if (((ulong)(&local_158)[uVar26] >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
                  (&local_158)[uVar26] =
                       (dxt1_block)(1L << ((byte)uVar19 & 0x3f) | (ulong)(&local_158)[uVar26]);
                  local_210 = (uchar *)CONCAT44(local_210._4_4_,uVar27);
                  uVar24 = determine_error((uint)local_228,block,uVar27,uVar36,local_180);
                  bVar16 = uVar24 < uVar25;
                  if (bVar16) {
                    uVar35 = (uint)local_210;
                  }
                  uVar27 = (uint)local_220;
                  if (bVar16) {
                    uVar27 = uVar36;
                  }
                  local_220 = (undefined1 *)CONCAT44(local_220._4_4_,uVar27);
                  if (bVar16) {
                    uVar25 = uVar24;
                  }
                  local_180 = uVar25;
                }
                high16 = local_1e8;
                puVar31 = local_218;
                lVar37 = lVar37 + 1;
              } while (lVar37 != 0x11);
              paVar23 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                        &(local_1c0->field_0).g;
            } while (paVar23 != (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)0x11
                    );
            local_229 = *local_1e8 != (uint)local_220 || *local_218 != uVar35;
            if (*local_1e8 != (uint)local_220 || *local_218 != uVar35) {
              *local_218 = uVar35;
              *local_1e8 = (uint)local_220;
              determine_selectors((uint)local_228,block,*local_218,(uint)local_220,pSelectors);
            }
            uVar35 = 0;
            local_118 = 0;
            uVar40 = local_228;
            do {
              puVar15 = local_218;
              local_134 = uVar35;
              uVar35 = *puVar31;
              uVar36 = *high16;
              local_248[0] = ryg_dxt::Expand5[uVar35 >> 0xb & 0x1f];
              local_248[1] = ryg_dxt::Expand6[uVar35 >> 5 & 0x3f];
              local_248[2] = ryg_dxt::Expand5[uVar35 & 0x1f];
              local_248[4] = ryg_dxt::Expand5[uVar36 >> 0xb & 0x1f];
              local_248[5] = ryg_dxt::Expand6[uVar36 >> 5 & 0x3f];
              local_242 = ryg_dxt::Expand5[uVar36 & 0x1f];
              local_248[3] = 0;
              local_241 = 0;
              local_240 = (char)(((uint)local_248[4] + (uint)local_248[0] * 2) / 3);
              local_23f = (char)(((uint)local_248[5] + (uint)local_248[1] * 2) / 3);
              local_23e = (char)(((uint)local_242 + (uint)local_248[2] * 2) / 3);
              local_23c = (char)(((uint)local_248[0] + (uint)local_248[4] * 2) / 3);
              local_23b = (char)(((uint)local_248[1] + (uint)local_248[5] * 2) / 3);
              local_23a = (char)(((uint)local_248[2] + (uint)local_242 * 2) / 3);
              local_208 = 0;
              lStack_200 = 0;
              local_1f8 = 0;
              if ((int)uVar40 == 0) {
                local_208 = 0;
              }
              else {
                lStack_200 = 0;
                local_1f8 = 0;
                uVar20 = 0;
                local_208 = 0;
                do {
                  uVar21 = (ulong)pSelectors[uVar20];
                  iVar88 = (uint)block[uVar20].field_0.field_0.r - (uint)local_248[uVar21 * 4];
                  local_208 = local_208 + (ulong)(uint)(iVar88 * iVar88);
                  iVar88 = (uint)block[uVar20].field_0.field_0.g - (uint)local_248[uVar21 * 4 + 1];
                  lStack_200 = lStack_200 + (ulong)(uint)(iVar88 * iVar88);
                  iVar88 = (uint)block[uVar20].field_0.field_0.b - (uint)local_248[uVar21 * 4 + 2];
                  local_1f8 = local_1f8 + (ulong)(uint)(iVar88 * iVar88);
                  uVar20 = uVar20 + 1;
                } while (uVar33 != uVar20);
              }
              dxt1_block::unpack_color((dxt1_block *)&local_1b8.field_0,(uint16)uVar35,false,0xff);
              local_170 = local_1b8;
              dxt1_block::unpack_color((dxt1_block *)&local_1b8.field_0,(uint16)*high16,false,0xff);
              local_16c = local_1b8;
              dxt1_block::unpack_color((dxt1_block *)&local_1b8.field_0,(uint16)*puVar15,true,0xff);
              local_100 = local_1b8;
              dxt1_block::unpack_color((dxt1_block *)&local_1b8.field_0,(uint16)*high16,true,0xff);
              lVar37 = 0;
              local_fc = local_1b8;
              bVar16 = false;
              pcVar32 = block;
              uVar40 = local_228;
              do {
                if ((&local_208)[lVar37] != 0) {
                  local_220 = ryg_dxt::Expand5;
                  if (lVar37 == 1) {
                    local_220 = ryg_dxt::Expand6;
                  }
                  local_210 = local_100.c + lVar37;
                  puVar34 = local_170.c + lVar37;
                  local_1d8._0_8_ = puVar34;
                  lVar22 = 0;
                  do {
                    uVar20 = lVar22 * 4 ^ 4;
                    *(uint *)((long)&local_1b8 + uVar20) = (uint)local_210[uVar20];
                    local_1c0 = &local_16c;
                    if (lVar22 == 0) {
                      local_1c0 = &local_170;
                    }
                    if (lVar22 == 0) {
                      high16 = local_218;
                    }
                    local_178 = high16;
                    iVar88 = -1;
                    do {
                      uVar35 = (uint)puVar34[lVar22 * 4] + iVar88;
                      if ((-1 < (int)uVar35) && ((int)uVar35 <= (int)(&DAT_001baa00)[lVar37])) {
                        aVar29.m_u32._1_3_ = 0;
                        aVar29.field_0.r = local_220[uVar35];
                        (&local_1b8)[lVar22] = aVar29;
                        local_1b0 = (local_1b4 + local_1b8.m_u32 * 2) / 3;
                        local_1ac = (local_1b8.m_u32 + local_1b4 * 2) / 3;
                        if ((int)uVar40 == 0) {
                          uVar20 = 0;
                        }
                        else {
                          uVar21 = 1;
                          uVar20 = 0;
                          do {
                            iVar91 = (&local_1b8)[pSelectors[uVar21 - 1]].m_u32 -
                                     (uint)pcVar32[uVar21 - 1].field_0.field_0.r;
                            uVar20 = (uint)(iVar91 * iVar91) + uVar20;
                            if (uVar33 <= uVar21) break;
                            uVar21 = uVar21 + 1;
                          } while (uVar20 < (ulong)(&local_208)[lVar37]);
                        }
                        puVar34 = (uchar *)local_1d8._0_8_;
                        if (uVar20 < (ulong)(&local_208)[lVar37]) {
                          *(uchar *)(local_1d8._0_8_ + lVar22 * 4) = (uchar)uVar35;
                          local_210[lVar22 * 4] = local_1b8.c[lVar22 * 4];
                          uVar17 = dxt1_block::pack_color
                                             ((color_quad_u8 *)&local_1c0->field_0,false,0x7f);
                          puVar15 = local_1e8;
                          puVar31 = local_218;
                          *local_178 = (uint)uVar17;
                          determine_selectors((uint)local_228,block,*local_218,*local_1e8,pSelectors
                                             );
                          uVar35 = *puVar31;
                          uVar36 = *puVar15;
                          local_248[0] = ryg_dxt::Expand5[uVar35 >> 0xb & 0x1f];
                          local_248[1] = ryg_dxt::Expand6[uVar35 >> 5 & 0x3f];
                          local_248[2] = ryg_dxt::Expand5[uVar35 & 0x1f];
                          local_248[4] = ryg_dxt::Expand5[uVar36 >> 0xb & 0x1f];
                          local_248[5] = ryg_dxt::Expand6[uVar36 >> 5 & 0x3f];
                          local_242 = ryg_dxt::Expand5[uVar36 & 0x1f];
                          local_240 = (char)(((uint)local_248[4] + (uint)local_248[0] * 2) / 3);
                          local_23f = (char)(((uint)local_248[5] + (uint)local_248[1] * 2) / 3);
                          local_23e = (char)(((uint)local_242 + (uint)local_248[2] * 2) / 3);
                          local_23c = (char)(((uint)local_248[0] + (uint)local_248[4] * 2) / 3);
                          local_23b = (char)(((uint)local_248[1] + (uint)local_248[5] * 2) / 3);
                          local_23a = (char)(((uint)local_248[2] + (uint)local_242 * 2) / 3);
                          local_208 = 0;
                          lStack_200 = 0;
                          local_1f8 = 0;
                          if ((int)local_228 == 0) {
                            local_208 = 0;
                          }
                          else {
                            lStack_200 = 0;
                            local_1f8 = 0;
                            uVar33 = 0;
                            local_208 = 0;
                            do {
                              uVar20 = (ulong)local_110[uVar33];
                              iVar91 = (uint)block[uVar33].field_0.field_0.r -
                                       (uint)local_248[uVar20 * 4];
                              local_208 = local_208 + (ulong)(uint)(iVar91 * iVar91);
                              iVar91 = (uint)block[uVar33].field_0.field_0.g -
                                       (uint)local_248[uVar20 * 4 + 1];
                              lStack_200 = lStack_200 + (ulong)(uint)(iVar91 * iVar91);
                              iVar91 = (uint)block[uVar33].field_0.field_0.b -
                                       (uint)local_248[uVar20 * 4 + 2];
                              local_1f8 = local_1f8 + (ulong)(uint)(iVar91 * iVar91);
                              uVar33 = uVar33 + 1;
                            } while (local_108 != uVar33);
                          }
                          bVar16 = true;
                          pSelectors = local_110;
                          puVar34 = (uchar *)local_1d8._0_8_;
                          uVar40 = local_228;
                          uVar33 = local_108;
                        }
                      }
                      bVar41 = iVar88 < 0;
                      iVar88 = iVar88 + 2;
                    } while (bVar41);
                    bVar41 = lVar22 == 0;
                    lVar22 = lVar22 + 1;
                    high16 = local_1e8;
                  } while (bVar41);
                }
                low16 = local_218;
                n = (uint)uVar40;
                lVar37 = lVar37 + 1;
                pcVar32 = (color_quad_u8 *)((long)&pcVar32->field_0 + 1);
              } while (lVar37 != 3);
              uVar35 = local_134 & 0xff;
              if (!bVar16) break;
              uVar35 = 1;
              iVar88 = (int)local_118;
              local_118 = (ulong)(iVar88 + 1);
              puVar31 = local_218;
            } while (iVar88 == 0);
            if ((uVar35 & 1) == 0) {
              if ((local_229 & local_1dc < 3) != 1) break;
            }
            else {
              uVar25 = determine_error(n,block,*local_218,*high16,0xffffffffffffffff);
              n = (uint)local_228;
              if ((uVar25 == 0) || (2 < local_1dc)) break;
            }
            local_1dc = local_1dc + 1;
          } while( true );
        }
      }
    }
    else {
      memset(pSelectors,2,uVar33);
      *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2] |
               (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2] << 5 |
               (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2] << 0xb;
      *local_1e8 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2 + 1] |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2 + 1] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2 + 1] << 0xb;
      high16 = local_1e8;
    }
  }
  else {
    memset(pSelectors,2,uVar33);
    n = (uint)local_228;
    *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2] |
             (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2] << 0xb;
    *local_1e8 = (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[2] * 2 + 1] |
                 (uint)(byte)ryg_dxt::OMatch6[(ulong)local_1a0[1] * 2 + 1] << 5 |
                 (uint)(byte)ryg_dxt::OMatch5[(ulong)local_1a0[0] * 2 + 1] << 0xb;
    high16 = local_1e8;
  }
  uVar35 = *low16;
  if (uVar35 < *high16) {
    *low16 = *high16;
    *high16 = uVar35;
    if (n != 0) {
      uVar20 = 0;
      do {
        pSelectors[uVar20] = pSelectors[uVar20] ^ 1;
        uVar20 = uVar20 + 1;
      } while (uVar33 != uVar20);
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine) {
  CRNLIB_ASSERT((n & 15) == 0);

  uint ave_color[3];
  float axis[3];

  if (!optimize_block_colors(n, block, low16, high16, ave_color, axis)) {
    compress_solid_block(n, ave_color, low16, high16, pSelectors);
  } else {
    if (!determine_selectors(n, block, low16, high16, pSelectors))
      compress_solid_block(n, ave_color, low16, high16, pSelectors);
    else {
      if (refine_block(n, block, low16, high16, pSelectors))
        determine_selectors(n, block, low16, high16, pSelectors);

      if (refine)
        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
    }
  }

  if (low16 < high16) {
    utils::swap(low16, high16);
    for (uint i = 0; i < n; i++)
      pSelectors[i] ^= 1;
  }
}